

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O3

int evmap_signal_add_(event_base *base,int sig,event *ev)

{
  event_signal_map *map;
  eventop *peVar1;
  undefined8 *puVar2;
  int iVar3;
  void *pvVar4;
  event *peVar5;
  event **ppeVar6;
  
  if (0x40 < (uint)sig) {
    return -1;
  }
  peVar1 = base->evsigsel;
  map = &base->sigmap;
  if (((base->sigmap).nentries <= sig) && (iVar3 = evmap_make_space(map,sig,(int)ev), iVar3 == -1))
  {
    return -1;
  }
  ppeVar6 = (event **)map->entries[(uint)sig];
  if (ppeVar6 == (event **)0x0) {
    pvVar4 = event_mm_calloc_(1,base->evsigsel->fdinfo_len + 8);
    (base->sigmap).entries[(uint)sig] = pvVar4;
    puVar2 = (undefined8 *)(base->sigmap).entries[(uint)sig];
    if (puVar2 == (undefined8 *)0x0) {
      return -1;
    }
    *puVar2 = 0;
    ppeVar6 = (event **)map->entries[(uint)sig];
  }
  if (*ppeVar6 == (event *)0x0) {
    iVar3 = (*peVar1->add)(base,ev->ev_fd,0,8,(void *)0x0);
    if (iVar3 == -1) {
      return -1;
    }
    peVar5 = *ppeVar6;
    (ev->ev_).ev_io.ev_io_next.le_next = peVar5;
    if (peVar5 == (event *)0x0) goto LAB_00118068;
  }
  else {
    (ev->ev_).ev_io.ev_io_next.le_next = *ppeVar6;
    peVar5 = *ppeVar6;
  }
  (peVar5->ev_).ev_io.ev_io_next.le_prev = (event **)&ev->ev_;
LAB_00118068:
  *ppeVar6 = ev;
  (ev->ev_).ev_io.ev_io_next.le_prev = ppeVar6;
  return 1;
}

Assistant:

int
evmap_signal_add_(struct event_base *base, int sig, struct event *ev)
{
	const struct eventop *evsel = base->evsigsel;
	struct event_signal_map *map = &base->sigmap;
	struct evmap_signal *ctx = NULL;

	if (sig < 0 || sig >= NSIG)
		return (-1);

	if (sig >= map->nentries) {
		if (evmap_make_space(
			map, sig, sizeof(struct evmap_signal *)) == -1)
			return (-1);
	}
	GET_SIGNAL_SLOT_AND_CTOR(ctx, map, sig, evmap_signal, evmap_signal_init,
	    base->evsigsel->fdinfo_len);

	if (LIST_EMPTY(&ctx->events)) {
		if (evsel->add(base, ev->ev_fd, 0, EV_SIGNAL, NULL)
		    == -1)
			return (-1);
	}

	LIST_INSERT_HEAD(&ctx->events, ev, ev_signal_next);

	return (1);
}